

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O1

int * Expr_Mod(int *dest,int *xnode,FXlatExprState *state)

{
  undefined8 in_RAX;
  int *piVar1;
  int op2;
  int op1;
  undefined8 local_28;
  
  local_28 = in_RAX;
  piVar1 = (*XlatExprEval[xnode[-1]])((int *)&local_28,xnode + -1,state);
  piVar1 = (*XlatExprEval[*piVar1])((int *)((long)&local_28 + 4),piVar1,state);
  if ((int)local_28 == 0) {
    Printf("Xlat: Division by 0 for line type %d\n",(ulong)(uint)state->linetype);
    local_28 = 1;
  }
  *dest = local_28._4_4_ % (int)local_28;
  return piVar1;
}

Assistant:

static const int *Expr_Mod(int *dest, const int *xnode, FXlatExprState *state)
{
	int op1, op2;

	xnode = XlatExprEval[xnode[-1]](&op2, xnode-1, state);
	xnode = XlatExprEval[xnode[0]](&op1, xnode, state);
	Div0Check(op1, op2, state);
	*dest = op1 % op2;
	return xnode;
}